

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O0

void __thiscall Player::Player(Player *this,int range)

{
  int iVar1;
  int range_local;
  Player *this_local;
  
  this->_RANGE = range / 2;
  iVar1 = rand();
  this->x = iVar1 % (this->_RANGE + -1);
  iVar1 = rand();
  this->y = iVar1 % (this->_RANGE + -1);
  return;
}

Assistant:

Player::Player(int range)
{

    _RANGE = (range / 2);
    //std::cout<<"Range is: "<<_RANGE;
    //After each epoch the player is set randomly by calling its constructor in the range [0,max_allowed_value)
    this->x = rand() % (_RANGE - 1) + 0;
    this->y = rand() % (_RANGE - 1) + 0;
    //this->z = rand() % (_RANGE - 1) + 0;
}